

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall ExprVisitorTest::ExprVisitorTest(ExprVisitorTest *this)

{
  Reference this_00;
  LogicalConstant LVar1;
  undefined8 *in_RDI;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffff98;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined1 value;
  Test *in_stack_ffffffffffffffb0;
  TestResult local_1f [2];
  TestResult local_1d [20];
  allocator<char> local_9 [9];
  
  testing::Test::Test(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__ExprVisitorTest_0029efc0;
  std::allocator<char>::allocator();
  mp::BasicExprFactory<std::allocator<char>_>::BasicExprFactory
            (in_stack_ffffffffffffffa0,(allocator<char> *)in_stack_ffffffffffffff98);
  value = (undefined1)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  std::allocator<char>::~allocator(local_9);
  testing::StrictMock<MockVisitor>::StrictMock((StrictMock<MockVisitor> *)(in_RDI + 9));
  mp::Reference::Reference((Reference *)0x163ea0);
  mp::LogicalConstant::LogicalConstant((LogicalConstant *)0x163eb3);
  TestResult::TestResult(local_1d);
  testing::DefaultValue<TestResult>::Set();
  TestResult::TestResult(local_1f);
  testing::DefaultValue<TestResult>::Set();
  this_00 = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(in_stack_ffffffffffffff98,0);
  ((BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> *)(in_RDI + 0x398))->super_ExprBase =
       (ExprBase)this_00.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  LVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                    ((BasicExprFactory<std::allocator<char>_> *)
                     this_00.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                     impl_,(bool)value);
  ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> *)(in_RDI + 0x399))->super_ExprBase =
       (ExprBase)LVar1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  return;
}

Assistant:

ExprVisitorTest() {
    ::testing::DefaultValue<TestResult>::Set(TestResult(Dummy()));
    ::testing::DefaultValue<TestResult>::Set(TestResult(Dummy()));
    var_ = factory_.MakeVariable(0);
    false_ = factory_.MakeLogicalConstant(false);
  }